

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfutureinterface.cpp
# Opt level: O2

void __thiscall
QFutureInterfaceBasePrivate::disconnectOutputInterface
          (QFutureInterfaceBasePrivate *this,QFutureCallOutInterface *iface)

{
  qsizetype i;
  long in_FS_OFFSET;
  QFutureCallOutInterface *local_30;
  undefined1 local_28 [16];
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_28._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_30 = iface;
  local_28._0_8_ = this;
  QBasicMutex::lock((QBasicMutex *)this);
  local_28[8] = true;
  i = QtPrivate::indexOf<QFutureCallOutInterface*,QFutureCallOutInterface*>
                (&this->outputConnections,&local_30,0);
  if (i != -1) {
    QList<QFutureCallOutInterface_*>::removeAt(&this->outputConnections,i);
    (*local_30->_vptr_QFutureCallOutInterface[3])();
  }
  QMutexLocker<QMutex>::~QMutexLocker((QMutexLocker<QMutex> *)local_28);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QFutureInterfaceBasePrivate::disconnectOutputInterface(QFutureCallOutInterface *iface)
{
    QMutexLocker lock(&m_mutex);
    const qsizetype index = outputConnections.indexOf(iface);
    if (index == -1)
        return;
    outputConnections.removeAt(index);

    iface->callOutInterfaceDisconnected();
}